

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O1

void __thiscall RecordSet::Addp(RecordSet *this,Addr *p)

{
  if (0xfffffffeffffffff < (ulong)*p && (*p).BlockNum == -1) {
    p->BlockNum = 1;
    p->FileOff = 0;
    return;
  }
  if (p->FileOff == (int)(0x2000 / (long)this->RECORD_SIZE) + -1) {
    p->FileOff = 0;
    p->BlockNum = p->BlockNum + 1;
    return;
  }
  p->FileOff = p->FileOff + 1;
  return;
}

Assistant:

void RecordSet::Addp(Addr& p) {
	if (Equalp(p, -1, -1)) {
		p.BlockNum = 1;
		p.FileOff = 0;
	}
	else if(p.FileOff == MAX_RECORD-1){
		p.FileOff = 0;
		p.BlockNum++;
	}
	else {
		p.FileOff++;
	}
}